

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint32_t uVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  Descriptor *this_00;
  string *psVar7;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  AlphaNum *a_04;
  AlphaNum *a_05;
  Descriptor *descriptor;
  AlphaNum *a_06;
  AlphaNum *a_07;
  allocator local_cb9;
  key_type local_cb8;
  allocator local_c91;
  key_type local_c90;
  allocator local_c69;
  key_type local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  allocator local_be1;
  key_type local_be0;
  allocator local_bb9;
  key_type local_bb8;
  allocator local_b91;
  key_type local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  allocator local_b29;
  key_type local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  allocator local_aa1;
  key_type local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  allocator local_a19;
  key_type local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  AlphaNum local_978;
  undefined1 local_948 [8];
  string hasBitsMask;
  undefined1 local_8f8 [8];
  string hasBitsNumber;
  key_type local_8d0;
  allocator local_8a9;
  key_type local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  allocator local_861;
  key_type local_860;
  allocator local_839;
  key_type local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  allocator local_7f1;
  key_type local_7f0;
  allocator local_7c9;
  key_type local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  allocator local_781;
  key_type local_780;
  allocator local_759;
  key_type local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  allocator local_711;
  key_type local_710;
  allocator local_6e9;
  key_type local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  allocator local_6a1;
  key_type local_6a0;
  allocator local_679;
  key_type local_678;
  allocator local_651;
  key_type local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  allocator local_5e9;
  key_type local_5e8;
  string local_5c8;
  allocator local_5a1;
  key_type local_5a0;
  string local_580;
  allocator local_559;
  key_type local_558;
  string local_538;
  allocator local_511;
  key_type local_510;
  allocator local_4e9;
  key_type local_4e8;
  string local_4c8;
  allocator local_4a1;
  key_type local_4a0;
  string local_480;
  allocator local_459;
  key_type local_458;
  string local_438;
  allocator local_411;
  key_type local_410;
  string local_3f0;
  allocator local_3c9;
  key_type local_3c8;
  allocator local_3a1;
  key_type local_3a0;
  allocator local_379;
  key_type local_378;
  AlphaNum local_358;
  string local_328;
  AlphaNum local_308;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  int local_294;
  undefined1 local_290 [4];
  int i_1;
  string local_260;
  allocator local_239;
  key_type local_238;
  allocator local_211;
  key_type local_210;
  AlphaNum local_1f0;
  string local_1c0;
  allocator local_199;
  key_type local_198;
  AlphaNum local_178;
  string local_148;
  AlphaNum local_118;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  undefined1 local_70 [8];
  string tag_bytes;
  uint8 tag_array [5];
  uint tag;
  int part_tag_size;
  int tag_size;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldGeneratorBase *this_local;
  
  iVar2 = FieldDescriptor::number(this->descriptor_);
  TVar3 = FieldDescriptor::type(this->descriptor_);
  sVar5 = internal::WireFormat::TagSize(iVar2,TVar3);
  iVar2 = (int)sVar5;
  TVar3 = FieldDescriptor::type(this->descriptor_);
  tag_array._1_4_ = iVar2;
  if (TVar3 == TYPE_GROUP) {
    tag_array._1_4_ = iVar2 / 2;
  }
  uVar4 = internal::WireFormat::MakeTag(this->descriptor_);
  io::CodedOutputStream::WriteVarint32ToArray
            (uVar4,(uint8_t *)(tag_bytes.field_2._M_local_buf + 0xf));
  strings::AlphaNum::AlphaNum((AlphaNum *)local_a0,(uint)(byte)tag_bytes.field_2._M_local_buf[0xf]);
  StrCat_abi_cxx11_((string *)local_70,(protobuf *)local_a0,a);
  for (local_a4 = 1; local_a4 < (int)tag_array._1_4_; local_a4 = local_a4 + 1) {
    strings::AlphaNum::AlphaNum
              (&local_118,(uint)(byte)tag_bytes.field_2._M_local_buf[(long)local_a4 + 0xf]);
    StrCat_abi_cxx11_(&local_e8,(protobuf *)&local_118,a_00);
    std::operator+(&local_c8,", ",&local_e8);
    std::__cxx11::string::operator+=((string *)local_70,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  strings::AlphaNum::AlphaNum(&local_178,uVar4);
  StrCat_abi_cxx11_(&local_148,(protobuf *)&local_178,a_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"tag",&local_199);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_198);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)&local_148);
  strings::AlphaNum::AlphaNum(&local_1f0,iVar2);
  StrCat_abi_cxx11_(&local_1c0,(protobuf *)&local_1f0,a_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"tag_size",&local_211);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_210);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"tag_bytes",&local_239);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_238);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_70);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  TVar3 = FieldDescriptor::type(this->descriptor_);
  if (TVar3 == TYPE_GROUP) {
    iVar2 = FieldDescriptor::number(this->descriptor_);
    uVar4 = internal::WireFormatLite::MakeTag(iVar2,WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteVarint32ToArray
              (uVar4,(uint8_t *)(tag_bytes.field_2._M_local_buf + 0xf));
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)local_290,(uint)(byte)tag_bytes.field_2._M_local_buf[0xf]);
    StrCat_abi_cxx11_(&local_260,(protobuf *)local_290,a_03);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    for (local_294 = 1; local_294 < (int)tag_array._1_4_; local_294 = local_294 + 1) {
      strings::AlphaNum::AlphaNum
                (&local_308,(uint)(byte)tag_bytes.field_2._M_local_buf[(long)local_294 + 0xf]);
      StrCat_abi_cxx11_(&local_2d8,(protobuf *)&local_308,a_04);
      std::operator+(&local_2b8,", ",&local_2d8);
      std::__cxx11::string::operator+=((string *)local_70,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    strings::AlphaNum::AlphaNum(&local_358,uVar4);
    StrCat_abi_cxx11_(&local_328,(protobuf *)&local_358,a_05);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"end_tag",&local_379);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_378);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"end_tag_bytes",&local_3a1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_3a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)local_70);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"access_level",&local_3c9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_3c8);
  std::__cxx11::string::operator=((string *)pmVar6,"public");
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  property_name_abi_cxx11_(&local_3f0,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"property_name",&local_411);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_410);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string((string *)&local_3f0);
  type_name_abi_cxx11_(&local_438,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"type_name",&local_459);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_458);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string((string *)&local_438);
  this_00 = FieldDescriptor::containing_type(this->descriptor_);
  GetClassName_abi_cxx11_(&local_480,(csharp *)this_00,descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"extended_type",&local_4a1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_4a0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string((string *)&local_480);
  name_abi_cxx11_(&local_4c8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"name",&local_4e9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_4e8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c8);
  psVar7 = FieldDescriptor::name_abi_cxx11_(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"descriptor_name",&local_511);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_510);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  default_value_abi_cxx11_(&local_538,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_558,"default_value",&local_559);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_558);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::__cxx11::string::~string((string *)&local_538);
  capitalized_type_name_abi_cxx11_(&local_580,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"capitalized_type_name",&local_5a1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_5a0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::__cxx11::string::~string((string *)&local_580);
  number_abi_cxx11_(&local_5c8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e8,"number",&local_5e9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_5e8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string((string *)&local_5c8);
  bVar1 = has_default_value(this);
  if ((!bVar1) || (bVar1 = SupportsPresenceApi(this->descriptor_), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6e8,"name",&local_6e9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_6e8);
    std::operator+(&local_6c8,pmVar6,"_");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_710,"name_def_message",&local_711);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_710);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_650,"name",&local_651);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_650);
    std::operator+(&local_630,pmVar6,"_ = ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_678,"default_value",&local_679);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_678);
    std::operator+(&local_610,&local_630,pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6a0,"name_def_message",&local_6a1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_6a0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_610);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator((allocator<char> *)&local_679);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
  }
  bVar1 = SupportsPresenceApi(this->descriptor_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_758,"property_name",&local_759);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_758);
    std::operator+(&local_738,"Has",pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_780,"has_property_check",&local_781);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_780);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_738);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7c8,"property_name",&local_7c9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_7c8);
    std::operator+(&local_7a8,"other.Has",pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7f0,"other_has_property_check",&local_7f1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_7f0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_838,"has_property_check",&local_839);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_838);
    std::operator+(&local_818,"!",pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_860,"has_not_property_check",&local_861);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_860);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_818);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator((allocator<char> *)&local_839);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8a8,"other_has_property_check",&local_8a9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_8a8);
    std::operator+(&local_888,"!",pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_8d0,"other_has_not_property_check",
               (allocator *)(hasBitsNumber.field_2._M_local_buf + 0xf));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_8d0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_888);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator((allocator<char> *)(hasBitsNumber.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
    if (this->presenceIndex_ != -1) {
      iVar2 = this->presenceIndex_;
      if (iVar2 < 0) {
        iVar2 = iVar2 + 0x1f;
      }
      strings::AlphaNum::AlphaNum((AlphaNum *)((long)&hasBitsMask.field_2 + 8),iVar2 >> 5);
      StrCat_abi_cxx11_((string *)local_8f8,(protobuf *)(hasBitsMask.field_2._M_local_buf + 8),a_06)
      ;
      strings::AlphaNum::AlphaNum(&local_978,1 << ((byte)this->presenceIndex_ & 0x1f));
      StrCat_abi_cxx11_((string *)local_948,(protobuf *)&local_978,a_07);
      std::operator+(&local_9f8,"(_hasBits",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8)
      ;
      std::operator+(&local_9d8,&local_9f8," & ");
      std::operator+(&local_9b8,&local_9d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_948)
      ;
      std::operator+(&local_998,&local_9b8,") != 0");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a18,"has_field_check",&local_a19);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_a18);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_998);
      std::__cxx11::string::~string((string *)&local_a18);
      std::allocator<char>::~allocator((allocator<char> *)&local_a19);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::__cxx11::string::~string((string *)&local_9d8);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::operator+(&local_a80,"_hasBits",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8)
      ;
      std::operator+(&local_a60,&local_a80," |= ");
      std::operator+(&local_a40,&local_a60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_948)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_aa0,"set_has_field",&local_aa1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_aa0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a40);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
      std::__cxx11::string::~string((string *)&local_a40);
      std::__cxx11::string::~string((string *)&local_a60);
      std::__cxx11::string::~string((string *)&local_a80);
      std::operator+(&local_b08,"_hasBits",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8)
      ;
      std::operator+(&local_ae8,&local_b08," &= ~");
      std::operator+(&local_ac8,&local_ae8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_948)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b28,"clear_has_field",&local_b29);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_b28);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_ac8);
      std::__cxx11::string::~string((string *)&local_b28);
      std::allocator<char>::~allocator((allocator<char> *)&local_b29);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::__cxx11::string::~string((string *)&local_b08);
      std::__cxx11::string::~string((string *)local_948);
      std::__cxx11::string::~string((string *)local_8f8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b90,"property_name",&local_b91);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_b90);
    std::operator+(&local_b70,pmVar6," != ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bb8,"default_value",&local_bb9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_bb8);
    std::operator+(&local_b50,&local_b70,pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_be0,"has_property_check",&local_be1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_be0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_b50);
    std::__cxx11::string::~string((string *)&local_be0);
    std::allocator<char>::~allocator((allocator<char> *)&local_be1);
    std::__cxx11::string::~string((string *)&local_b50);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::~string((string *)&local_b90);
    std::allocator<char>::~allocator((allocator<char> *)&local_b91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c68,"property_name",&local_c69);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c68);
    std::operator+(&local_c48,"other.",pmVar6);
    std::operator+(&local_c28,&local_c48," != ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c90,"default_value",&local_c91);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_c90);
    std::operator+(&local_c08,&local_c28,pmVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cb8,"other_has_property_check",&local_cb9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_cb8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c08);
    std::__cxx11::string::~string((string *)&local_cb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
    std::__cxx11::string::~string((string *)&local_c08);
    std::__cxx11::string::~string((string *)&local_c90);
    std::allocator<char>::~allocator((allocator<char> *)&local_c91);
    std::__cxx11::string::~string((string *)&local_c28);
    std::__cxx11::string::~string((string *)&local_c48);
    std::__cxx11::string::~string((string *)&local_c68);
    std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  }
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    std::map<std::string, std::string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8 tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  std::string tag_bytes = StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    tag_bytes += ", " + StrCat(tag_array[i]);
  }

  (*variables)["tag"] = StrCat(tag);
  (*variables)["tag_size"] = StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
        tag_bytes += ", " + StrCat(tag_array[i]);
    }

    variables_["end_tag"] = StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = descriptor_->name();
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !SupportsPresenceApi(descriptor_)) {
    (*variables)["name_def_message"] =
      (*variables)["name"] + "_ = " + (*variables)["default_value"];
  } else {
    (*variables)["name_def_message"] = (*variables)["name"] + "_";
  }
  if (SupportsPresenceApi(descriptor_)) {
    (*variables)["has_property_check"] = "Has" + (*variables)["property_name"];
    (*variables)["other_has_property_check"] = "other.Has" + (*variables)["property_name"];
    (*variables)["has_not_property_check"] = "!" + (*variables)["has_property_check"];
    (*variables)["other_has_not_property_check"] = "!" + (*variables)["other_has_property_check"];
    if (presenceIndex_ != -1) {
      std::string hasBitsNumber = StrCat(presenceIndex_ / 32);
      std::string hasBitsMask = StrCat(1 << (presenceIndex_ % 32));
      (*variables)["has_field_check"] = "(_hasBits" + hasBitsNumber + " & " + hasBitsMask + ") != 0";
      (*variables)["set_has_field"] = "_hasBits" + hasBitsNumber + " |= " + hasBitsMask;
      (*variables)["clear_has_field"] = "_hasBits" + hasBitsNumber + " &= ~" + hasBitsMask;
    }
  } else {
    (*variables)["has_property_check"] =
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
    (*variables)["other_has_property_check"] = "other." +
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
  }
}